

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall
wabt::TypeChecker::OnSimdLoadLane(TypeChecker *this,Opcode opcode,Limits *limits,uint64_t lane_idx)

{
  Result rhs;
  Result local_30;
  uint32_t local_2c;
  uint64_t uStack_28;
  uint32_t lane_count;
  uint64_t lane_idx_local;
  Limits *limits_local;
  TypeChecker *this_local;
  Opcode opcode_local;
  Result result;
  
  uStack_28 = lane_idx;
  lane_idx_local = (uint64_t)limits;
  limits_local = (Limits *)this;
  this_local._0_4_ = opcode.enum_;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  local_2c = Opcode::GetSimdLaneCount((Opcode *)&this_local);
  if (local_2c <= uStack_28) {
    PrintError(this,"lane index must be less than %d (got %lu)",(ulong)local_2c,uStack_28);
    Result::Result(&local_30,Error);
    this_local._4_4_ = local_30.enum_;
  }
  rhs = CheckOpcode2(this,this_local._0_4_,(Limits *)lane_idx_local);
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::OnSimdLoadLane(Opcode opcode,
                                   const Limits& limits,
                                   uint64_t lane_idx) {
  Result result = Result::Ok;
  uint32_t lane_count = opcode.GetSimdLaneCount();
  if (lane_idx >= lane_count) {
    PrintError("lane index must be less than %d (got %" PRIu64 ")", lane_count,
               lane_idx);
    result = Result::Error;
  }
  result |= CheckOpcode2(opcode, &limits);
  return result;
}